

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

unsigned_long tjPlaneSizeYUV(int componentID,int width,int stride,int height,int subsamp)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  if ((height < 1 || width < 1) || 5 < (uint)subsamp) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),": Invali",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"d argume",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjPlaneS",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"izeYUV()",8);
    *(undefined4 *)(in_FS_OFFSET + -0xb1) = 0x746e65;
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar1 = tjPlaneWidth(componentID,width,subsamp);
    uVar2 = tjPlaneHeight(componentID,height,subsamp);
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)(uVar1 | uVar2)) {
      uVar4 = (ulong)(uint)-stride;
      if (0 < stride) {
        uVar4 = (ulong)(uint)stride;
      }
      if (stride == 0) {
        uVar4 = (ulong)uVar1;
      }
      uVar3 = (ulong)uVar1 + (long)(int)(uVar2 - 1) * uVar4;
    }
  }
  return uVar3;
}

Assistant:

DLLEXPORT unsigned long tjPlaneSizeYUV(int componentID, int width, int stride,
                                       int height, int subsamp)
{
  unsigned long long retval = 0;
  int pw, ph;

  if (width < 1 || height < 1 || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjPlaneSizeYUV(): Invalid argument");

  pw = tjPlaneWidth(componentID, width, subsamp);
  ph = tjPlaneHeight(componentID, height, subsamp);
  if (pw < 0 || ph < 0) return -1;

  if (stride == 0) stride = pw;
  else stride = abs(stride);

  retval = (unsigned long long)stride * (ph - 1) + pw;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjPlaneSizeYUV(): Image is too large");

bailout:
  return (unsigned long)retval;
}